

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

void __thiscall Solution::mutate_inversion(Solution *this)

{
  Vehicle *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppVVar4;
  __shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar5;
  mapped_type *pmVar6;
  reference ppVar7;
  reference ppVar8;
  ulong __n;
  ulong __n_00;
  pair<Point_*,_int> pair_1;
  iterator __end3;
  iterator __begin3;
  list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *__range3;
  Point *pPStack_e8;
  int ec;
  Point *p_1;
  undefined1 local_d8 [8];
  reverse_iterator rit;
  int i;
  pair<Point_*,_int> pair;
  _Self local_b0;
  iterator __end1;
  iterator __begin1;
  list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *__range1;
  int local_90;
  int remove_pos;
  Solution *local_80;
  pair<Point_*,_int> local_78;
  Point *local_68;
  Point *p;
  undefined1 local_58 [8];
  list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> points_list;
  iterator nit2;
  iterator nit;
  size_type range_min;
  size_type range_max;
  Vehicle *v1;
  iterator vit;
  Solution *this_local;
  
  vit._M_node = (_List_node_base *)this;
  v1 = (Vehicle *)std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
  iVar2 = rand();
  sVar3 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::size(&this->vehicles);
  std::advance<std::_List_iterator<Vehicle*>,unsigned_long>
            ((_List_iterator<Vehicle_*> *)&v1,(ulong)(long)iVar2 % sVar3);
  ppVVar4 = std::_List_iterator<Vehicle_*>::operator*((_List_iterator<Vehicle_*> *)&v1);
  this_00 = *ppVVar4;
  sVar3 = std::__cxx11::
          list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::size
                    (&this_00->nodes);
  if (sVar3 < 3) {
    return;
  }
  iVar2 = rand();
  sVar3 = std::__cxx11::
          list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::size
                    (&this_00->nodes);
  __n = (ulong)(long)iVar2 % (sVar3 - 2) + 2;
  iVar2 = rand();
  __n_00 = (ulong)(long)iVar2 % __n;
  nit2 = std::__cxx11::
         list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::begin
                   (&this_00->nodes);
  std::advance<std::_List_iterator<std::shared_ptr<VehicleState>>,unsigned_long>(&nit2,__n_00);
  points_list.super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>.
  _M_impl._M_node._M_size =
       (size_t)std::__cxx11::
               list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
               ::begin(&this_00->nodes);
  std::advance<std::_List_iterator<std::shared_ptr<VehicleState>>,unsigned_long>
            ((_List_iterator<std::shared_ptr<VehicleState>_> *)
             &points_list.
              super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>.
              _M_impl._M_node._M_size,__n);
  std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::list
            ((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)local_58);
  while( true ) {
    p = (Point *)std::_List_iterator<std::shared_ptr<VehicleState>_>::operator++(&nit2,0);
    bVar1 = std::operator!=((_Self *)&p,
                            (_Self *)&points_list.
                                      super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
                                      ._M_impl._M_node._M_size);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::_List_iterator<std::shared_ptr<VehicleState>_>::operator*(&nit2);
    peVar5 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    local_68 = peVar5->p;
    local_80 = this;
    pmVar6 = std::
             unordered_map<Solution_*,_std::pair<Vehicle_*,_int>,_std::hash<Solution_*>,_std::equal_to<Solution_*>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>_>
             ::operator[](&local_68->state,&local_80);
    std::pair<Point_*,_int>::pair<Point_*&,_int_&,_true>(&local_78,&local_68,&pmVar6->second);
    std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::
    push_back((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)local_58,
              &local_78);
  }
  __range1 = (list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)
             std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
             ::begin((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)
                     local_58);
  ppVar7 = std::_List_iterator<std::pair<Point_*,_int>_>::operator*
                     ((_List_iterator<std::pair<Point_*,_int>_> *)&__range1);
  local_90 = ppVar7->second;
  __end1 = std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::
           begin((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)
                 local_58);
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::end
                 ((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)
                  local_58);
  while (bVar1 = std::operator!=(&__end1,&local_b0), bVar1) {
    std::_List_iterator<std::pair<Point_*,_int>_>::operator*(&__end1);
    Vehicle::remove_node(this_00,local_90);
    std::_List_iterator<std::pair<Point_*,_int>_>::operator++(&__end1);
  }
  rit.current._M_node._4_4_ = 0;
  std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::rbegin
            ((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)local_d8);
  while( true ) {
    std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::rend
              ((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)&p_1);
    bVar1 = std::operator!=((reverse_iterator<std::_List_iterator<std::pair<Point_*,_int>_>_> *)
                            local_d8,(reverse_iterator<std::_List_iterator<std::pair<Point_*,_int>_>_>
                                      *)&p_1);
    if (!bVar1) goto LAB_0010c85e;
    ppVar8 = std::reverse_iterator<std::_List_iterator<std::pair<Point_*,_int>_>_>::operator*
                       ((reverse_iterator<std::_List_iterator<std::pair<Point_*,_int>_>_> *)local_d8
                       );
    pPStack_e8 = ppVar8->first;
    __range3._4_4_ = 0;
    nit._M_node._0_4_ = (int)__n_00;
    iVar2 = (int)nit._M_node + rit.current._M_node._4_4_;
    rit.current._M_node._4_4_ = rit.current._M_node._4_4_ + 1;
    Vehicle::add_node(this_00,pPStack_e8,iVar2,(int *)((long)&__range3 + 4));
    if (__range3._4_4_ != 0) break;
    std::reverse_iterator<std::_List_iterator<std::pair<Point_*,_int>_>_>::operator++
              ((reverse_iterator<std::_List_iterator<std::pair<Point_*,_int>_>_> *)local_d8);
  }
  __range3._4_4_ = 0;
  while (rit.current._M_node._4_4_ = rit.current._M_node._4_4_ + -1, 0 < rit.current._M_node._4_4_)
  {
    Vehicle::remove_node(this_00,(int)nit._M_node);
  }
  __end3 = std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::
           begin((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)
                 local_58);
  pair_1._8_8_ = std::__cxx11::
                 list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::end
                           ((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
                             *)local_58);
  while (bVar1 = std::operator!=(&__end3,(_Self *)&pair_1.second), bVar1) {
    ppVar7 = std::_List_iterator<std::pair<Point_*,_int>_>::operator*(&__end3);
    pair_1.first = *(Point **)&ppVar7->second;
    Vehicle::add_node(this_00,ppVar7->first,(int)pair_1.first,(int *)((long)&__range3 + 4));
    std::_List_iterator<std::pair<Point_*,_int>_>::operator++(&__end3);
  }
LAB_0010c85e:
  std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::~list
            ((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)local_58);
  return;
}

Assistant:

void Solution::mutate_inversion() {
    auto vit = vehicles.begin();
    std::advance(vit, rand() % vehicles.size());
    auto v1 = *vit;

    if (v1->nodes.size() < 3)
        return;
    auto range_max = rand() % (v1->nodes.size() - 2) + 2;
    auto range_min = rand() % range_max;

    auto nit = v1->nodes.begin();
    std::advance(nit, range_min);
    auto nit2 = v1->nodes.begin();
    std::advance(nit2, range_max);

    std::list<std::pair<Point *, int>> points_list;

    while (nit++ != nit2) {
        auto p = (*nit)->p;
        points_list.push_back(std::pair<Point *, int>(p, p->state[this].second));
        //v1->remove_node(p->state[this].second);//invalidate iterators
    }

    int remove_pos = (*points_list.begin()).second;
    for (auto pair: points_list) {
        v1->remove_node(remove_pos);
    }

    auto i = 0;
    for (auto rit = points_list.rbegin(); rit != points_list.rend(); ++rit) {
        auto p = (*rit).first;
        auto ec = 0;
        v1->add_node(p, range_min + i++, ec);
        if (ec != 0) {//Error, repair route
            ec = 0;
            while (--i > 0) {
                v1->remove_node(range_min);
            }
            for (auto pair: points_list) {
                v1->add_node(pair.first, pair.second, ec);
            }
            break;
        }
    }


}